

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

void xmlSchematronSetValidStructuredErrors
               (xmlSchematronValidCtxtPtr ctxt,xmlStructuredErrorFunc serror,void *ctx)

{
  void *ctx_local;
  xmlStructuredErrorFunc serror_local;
  xmlSchematronValidCtxtPtr ctxt_local;
  
  if (ctxt != (xmlSchematronValidCtxtPtr)0x0) {
    ctxt->serror = serror;
    ctxt->error = (xmlSchematronValidityErrorFunc)0x0;
    ctxt->warning = (xmlSchematronValidityWarningFunc)0x0;
    ctxt->userData = ctx;
  }
  return;
}

Assistant:

void
xmlSchematronSetValidStructuredErrors(xmlSchematronValidCtxtPtr ctxt,
                                      xmlStructuredErrorFunc serror, void *ctx)
{
    if (ctxt == NULL)
        return;
    ctxt->serror = serror;
    ctxt->error = NULL;
    ctxt->warning = NULL;
    ctxt->userData = ctx;
}